

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall
llvm::detail::DoubleAPFloat::toString
          (DoubleAPFloat *this,SmallVectorImpl<char> *Str,uint FormatPrecision,uint FormatMaxPadding
          ,bool TruncateZero)

{
  DoubleAPFloat local_58;
  APFloat local_48;
  byte local_21;
  uint local_20;
  uint uStack_1c;
  bool TruncateZero_local;
  uint FormatMaxPadding_local;
  uint FormatPrecision_local;
  SmallVectorImpl<char> *Str_local;
  DoubleAPFloat *this_local;
  
  local_21 = TruncateZero;
  local_20 = FormatMaxPadding;
  uStack_1c = FormatPrecision;
  _FormatMaxPadding_local = Str;
  Str_local = (SmallVectorImpl<char> *)this;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x111d,
                  "void llvm::detail::DoubleAPFloat::toString(SmallVectorImpl<char> &, unsigned int, unsigned int, bool) const"
                 );
  }
  bitcastToAPInt(&local_58);
  APFloat::APFloat(&local_48,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_58);
  APFloat::toString(&local_48,_FormatMaxPadding_local,uStack_1c,local_20,(bool)(local_21 & 1));
  APFloat::~APFloat(&local_48);
  APInt::~APInt((APInt *)&local_58);
  return;
}

Assistant:

void DoubleAPFloat::toString(SmallVectorImpl<char> &Str,
                             unsigned FormatPrecision,
                             unsigned FormatMaxPadding,
                             bool TruncateZero) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .toString(Str, FormatPrecision, FormatMaxPadding, TruncateZero);
}